

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformChoice(Impl *this,AtomSpan *atoms)

{
  size_type *psVar1;
  uint *puVar2;
  Atom_t h;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  long lVar6;
  Lit_t bLit;
  LitSpan bAux;
  int local_64;
  LitSpan local_60;
  LitVec *local_50;
  long local_48;
  LitSpan local_40;
  
  local_40.first = &local_64;
  local_64 = 0;
  local_40.size = 1;
  puVar2 = atoms->first;
  local_50 = &this->lits_;
  local_48 = atoms->size << 2;
  uVar5 = 0;
  for (lVar6 = 0; local_48 != lVar6; lVar6 = lVar6 + 4) {
    h = newAtom(this);
    local_64 = -*(int *)((long)puVar2 + lVar6);
    local_60.first = (int *)CONCAT44(local_60.first._4_4_,-h);
    bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(local_50,(int *)&local_60);
    local_60.size = (size_t)(this->lits_).ebo_.size;
    local_60.first = (int *)local_60.size;
    if ((pointer)local_60.size != (pointer)0x0) {
      local_60.first = (this->lits_).ebo_.buf;
    }
    uVar3 = addRule(this,*(Atom_t *)((long)puVar2 + lVar6),&local_60);
    uVar4 = addRule(this,h,&local_40);
    uVar5 = uVar5 + uVar4 + uVar3;
    psVar1 = &(this->lits_).ebo_.size;
    *psVar1 = *psVar1 - 1;
  }
  return uVar5;
}

Assistant:

uint32 RuleTransform::Impl::transformChoice(const Potassco::AtomSpan& atoms) {
	uint32 nRule = 0;
	Potassco::Lit_t   bLit = 0;
	Potassco::LitSpan bAux = Potassco::toSpan(&bLit, 1);
	Atom_t hAux;
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms), end = Potassco::end(atoms); it != end; ++it) {
		hAux = newAtom();
		bLit = Potassco::neg(*it);
		lits_.push_back(Potassco::neg(hAux));
		nRule += addRule(*it, Potassco::toSpan(lits_));
		nRule += addRule(hAux, bAux);
		lits_.pop_back();
	}
	return nRule;
}